

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O3

bool __thiscall
Nova::Grid<float,_2>::Inside_Domain(Grid<float,_2> *this,T_INDEX *index,int number_of_ghost_cells)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  bool bVar4;
  int *piVar5;
  long lVar6;
  undefined8 local_10;
  undefined8 local_8;
  
  uVar3 = *(undefined8 *)(this->counts)._data._M_elems;
  local_10 = CONCAT44(1 - number_of_ghost_cells,1 - number_of_ghost_cells);
  local_8 = CONCAT44((int)((ulong)uVar3 >> 0x20) + number_of_ghost_cells,
                     (int)uVar3 + number_of_ghost_cells);
  bVar4 = true;
  lVar6 = 0;
  piVar5 = (int *)&local_10;
  do {
    iVar1 = (index->_data)._M_elems[lVar6];
    iVar2 = *piVar5;
    if (!bVar4) break;
    lVar6 = 1;
    bVar4 = false;
    piVar5 = (int *)((long)&local_10 + 4);
  } while (iVar2 <= iVar1);
  if (iVar1 < iVar2) {
    return false;
  }
  bVar4 = true;
  lVar6 = 0;
  do {
    iVar1 = (index->_data)._M_elems[lVar6];
    iVar2 = *(int *)((long)&local_8 + lVar6 * 4);
    if (!bVar4) {
      return iVar1 <= iVar2;
    }
    lVar6 = 1;
    bVar4 = false;
  } while (iVar1 <= iVar2);
  return iVar1 <= iVar2;
}

Assistant:

Vector(const Vector& other)
        :_data(other._data)
    {}